

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like_optimizations.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::LikeOptimizationRule::Apply
          (LikeOptimizationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  reference pvVar5;
  BoundFunctionExpression *function;
  BoundConstantExpression *pBVar6;
  ClientContext *context;
  string *psVar7;
  reference pvVar8;
  reference pvVar9;
  BoundComparisonExpression *this_00;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  pointer *__ptr;
  pointer pcVar13;
  BoundFunctionExpression *pBVar14;
  BaseScalarFunction *this_01;
  long lVar15;
  bool bVar16;
  bool bVar17;
  Value constant_value;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_4a8;
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  LogicalType local_440;
  Value local_428;
  Value local_3e8;
  BaseScalarFunction local_3a8;
  undefined1 local_2f8 [16];
  code *local_2e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_288;
  BaseScalarFunction local_280;
  undefined1 local_1d0 [16];
  code *local_1c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  ScalarFunction local_158;
  
  pvVar5 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  function = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                       (&pvVar5->_M_data->super_BaseExpression);
  pvVar5 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                     (&pvVar5->_M_data->super_BaseExpression);
  if ((pBVar6->value).is_null == true) {
    LogicalType::LogicalType(&local_440,&(function->super_Expression).return_type);
    Value::Value(&local_428,&local_440);
    pBVar6 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_3e8,&local_428);
    BoundConstantExpression::BoundConstantExpression(pBVar6,&local_3e8);
    Value::~Value(&local_3e8);
    (this->super_Rule)._vptr_Rule = (_func_int **)pBVar6;
    Value::~Value(&local_428);
    LogicalType::~LogicalType(&local_440);
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
  }
  iVar4 = (*(pBVar6->super_Expression).super_BaseExpression._vptr_BaseExpression[0xf])(pBVar6);
  if ((char)iVar4 == '\0') {
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
  }
  context = Rule::GetContext((Rule *)op);
  ExpressionExecutor::EvaluateScalar(&local_3e8,context,&pBVar6->super_Expression,false);
  psVar7 = StringValue::Get_abi_cxx11_(&local_3e8);
  iVar4 = ::std::__cxx11::string::compare
                    ((char *)&(function->function).super_BaseScalarFunction.super_SimpleFunction.
                              super_Function.name);
  uVar1 = psVar7->_M_string_length;
  if (uVar1 != 0) {
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    bVar16 = false;
    uVar11 = 1;
    do {
      if ((pcVar2[uVar11 - 1] == '%') || (pcVar2[uVar11 - 1] == '_')) break;
      bVar16 = uVar1 <= uVar11;
      bVar17 = uVar11 != uVar1;
      uVar11 = uVar11 + 1;
    } while (bVar17);
    if (!bVar16) {
      lVar3 = 0;
      pcVar13 = pcVar2;
      do {
        lVar15 = lVar3;
        pcVar13 = pcVar13 + -1;
        lVar10 = uVar1 - lVar15;
        if (lVar10 == 0) break;
        lVar3 = lVar15 + 1;
      } while (pcVar13[uVar1] == '%');
      if (lVar15 != 0) {
        do {
          if (lVar10 == 0) {
            PrefixFun::GetFunction();
            pBVar14 = (BoundFunctionExpression *)(psVar7->_M_dataplus)._M_p;
            local_460[0] = local_450;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_460,pBVar14,
                       (pointer)((long)&(pBVar14->super_Expression).super_BaseExpression.
                                        _vptr_BaseExpression + psVar7->_M_string_length));
            ApplyRule(this,pBVar14,(ScalarFunction *)function,(string *)&local_280,
                      SUB81(local_460,0));
            if (local_460[0] != local_450) {
              operator_delete(local_460[0]);
            }
            local_280.super_SimpleFunction.super_Function._vptr_Function =
                 (_func_int **)&PTR__ScalarFunction_01963628;
            if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
            }
            if (local_1c0 != (code *)0x0) {
              (*local_1c0)(local_1d0,local_1d0,3);
            }
            this_01 = &local_280;
            goto LAB_0067ce43;
          }
          lVar3 = lVar10 + -1;
        } while ((pcVar2[lVar3] != '%') && (lVar10 = lVar10 + -1, pcVar2[lVar3] != '_'));
      }
      uVar11 = 0;
      do {
        if (pcVar2[uVar11] != '%') {
          if (uVar11 == 0) goto LAB_0067cd35;
          if (uVar11 < uVar1) goto LAB_0067cc6b;
          break;
        }
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
      goto LAB_0067cc89;
    }
  }
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](&function->children,0);
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](&function->children,1);
  this_00 = (BoundComparisonExpression *)operator_new(0x68);
  local_428.type_._0_8_ =
       (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  local_4a8._M_head_impl =
       (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundComparisonExpression::BoundComparisonExpression
            (this_00,(iVar4 == 0) + COMPARE_BOUNDARY_START,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_428,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_4a8);
  if (local_4a8._M_head_impl != (Expression *)0x0) {
    (*((local_4a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_4a8._M_head_impl = (Expression *)0x0;
  if ((Expression *)local_428.type_._0_8_ != (Expression *)0x0) {
    (*((BaseExpression *)local_428.type_._0_8_)->_vptr_BaseExpression[1])();
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)this_00;
  goto LAB_0067ce48;
LAB_0067cd35:
  uVar11 = 0;
  do {
    uVar12 = uVar11;
    if (pcVar2[uVar11] != '%') break;
    uVar11 = uVar11 + 1;
    uVar12 = uVar1;
  } while (uVar1 != uVar11);
  lVar3 = 0;
  do {
    lVar10 = lVar3;
    uVar11 = uVar1;
    if (uVar11 == 0) break;
    uVar1 = uVar11 - 1;
    lVar3 = lVar10 + 1;
  } while (pcVar2[uVar11 - 1] == '%');
  if (lVar10 == 0 || uVar12 == 0) {
LAB_0067cd74:
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  }
  else {
    for (; uVar12 < uVar11; uVar12 = uVar12 + 1) {
      if ((pcVar2[uVar12] == '%') || (pcVar2[uVar12] == '_')) goto LAB_0067cd74;
    }
    GetStringContains();
    pBVar14 = (BoundFunctionExpression *)(psVar7->_M_dataplus)._M_p;
    local_4a0[0] = local_490;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_4a0,pBVar14,
               (pointer)((long)&(pBVar14->super_Expression).super_BaseExpression.
                                _vptr_BaseExpression + psVar7->_M_string_length));
    ApplyRule(this,pBVar14,(ScalarFunction *)function,(string *)&local_158,SUB81(local_4a0,0));
    if (local_4a0[0] != local_490) {
      operator_delete(local_4a0[0]);
    }
    ScalarFunction::~ScalarFunction(&local_158);
  }
  goto LAB_0067ce48;
  while (uVar11 = uVar11 + 1, uVar1 != uVar11) {
LAB_0067cc6b:
    if ((pcVar2[uVar11] == '%') || (pcVar2[uVar11] == '_')) goto LAB_0067cd35;
  }
LAB_0067cc89:
  SuffixFun::GetFunction();
  pBVar14 = (BoundFunctionExpression *)(psVar7->_M_dataplus)._M_p;
  local_480[0] = local_470;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_480,pBVar14,
             (pointer)((long)&(pBVar14->super_Expression).super_BaseExpression._vptr_BaseExpression
                      + psVar7->_M_string_length));
  ApplyRule(this,pBVar14,(ScalarFunction *)function,(string *)&local_3a8,SUB81(local_480,0));
  if (local_480[0] != local_470) {
    operator_delete(local_480[0]);
  }
  local_3a8.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_288 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288);
  }
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(local_2f8,local_2f8,3);
  }
  this_01 = &local_3a8;
LAB_0067ce43:
  BaseScalarFunction::~BaseScalarFunction(this_01);
LAB_0067ce48:
  Value::~Value(&local_3e8);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> LikeOptimizationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                   bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundFunctionExpression>();
	auto &constant_expr = bindings[2].get().Cast<BoundConstantExpression>();
	D_ASSERT(root.children.size() == 2);

	if (constant_expr.value.IsNull()) {
		return make_uniq<BoundConstantExpression>(Value(root.return_type));
	}

	// the constant_expr is a scalar expression that we have to fold
	if (!constant_expr.IsFoldable()) {
		return nullptr;
	}

	auto constant_value = ExpressionExecutor::EvaluateScalar(GetContext(), constant_expr);
	D_ASSERT(constant_value.type() == constant_expr.return_type);
	auto &patt_str = StringValue::Get(constant_value);

	bool is_not_like = root.function.name == "!~~";
	if (PatternIsConstant(patt_str)) {
		// Pattern is constant
		return make_uniq<BoundComparisonExpression>(is_not_like ? ExpressionType::COMPARE_NOTEQUAL
		                                                        : ExpressionType::COMPARE_EQUAL,
		                                            std::move(root.children[0]), std::move(root.children[1]));
	} else if (PatternIsPrefix(patt_str)) {
		// Prefix LIKE pattern : [^%_]*[%]+, ignoring underscore
		return ApplyRule(root, PrefixFun::GetFunction(), patt_str, is_not_like);
	} else if (PatternIsSuffix(patt_str)) {
		// Suffix LIKE pattern: [%]+[^%_]*, ignoring underscore
		return ApplyRule(root, SuffixFun::GetFunction(), patt_str, is_not_like);
	} else if (PatternIsContains(patt_str)) {
		// Contains LIKE pattern: [%]+[^%_]*[%]+, ignoring underscore
		return ApplyRule(root, GetStringContains(), patt_str, is_not_like);
	}
	return nullptr;
}